

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void ImGui::TableMergeDrawChannels(ImGuiTable *table)

{
  ImVec2 *pIVar1;
  undefined8 *puVar2;
  int *piVar3;
  ImVector<unsigned_short> *pIVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  char cVar8;
  byte bVar9;
  byte bVar10;
  ImDrawListSplitter *pIVar11;
  ImGuiTableColumn *pIVar12;
  ImDrawCmd *pIVar13;
  ImDrawChannel *pIVar14;
  int iVar15;
  int iVar16;
  undefined8 uVar17;
  unsigned_short *puVar18;
  undefined8 uVar19;
  ImGuiContext *pIVar20;
  int iVar21;
  ImDrawChannel *pIVar22;
  int n;
  long lVar23;
  int iVar24;
  ImDrawChannel *pIVar25;
  int iVar26;
  long lVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  MergeGroup *merge_group;
  byte bVar31;
  float *pfVar32;
  uint uVar33;
  uint uVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  ImBitArray<132,_0> remaining_mask;
  MergeGroup merge_groups [4];
  ImBitArray<132,_0> local_f8;
  float local_d8 [2];
  undefined8 uStack_d0;
  int iStack_c8;
  uint local_c4 [37];
  
  pIVar20 = GImGui;
  pIVar11 = table->DrawSplitter;
  cVar8 = table->FreezeRowsCount;
  bVar9 = table->FreezeColumnsCount;
  uVar33 = 0;
  memset(local_d8,0,0xa0);
  iVar21 = table->ColumnsCount;
  if (0 < (long)iVar21) {
    uVar29 = table->VisibleMaskByIndex;
    uVar30 = 0;
    do {
      if ((uVar29 >> (uVar30 & 0x3f) & 1) != 0) {
        pIVar12 = (table->Columns).Data;
        pIVar22 = (pIVar11->_Channels).Data;
        uVar34 = 1;
        do {
          bVar31 = (byte)uVar34;
          bVar10 = *(byte *)((long)&pIVar12[uVar30].Flags + ((ulong)uVar34 ^ 0x59));
          iVar26 = pIVar22[bVar10]._CmdBuffer.Size;
          lVar27 = (long)iVar26;
          if (0 < lVar27) {
            pIVar25 = pIVar22 + bVar10;
            pIVar13 = (pIVar25->_CmdBuffer).Data;
            if ((pIVar13[lVar27 + -1].ElemCount == 0) &&
               (pIVar13[lVar27 + -1].UserCallback != (ImDrawCallback)0x0)) {
              iVar26 = iVar26 + -1;
              (pIVar25->_CmdBuffer).Size = iVar26;
            }
            if (iVar26 == 1) {
              if ((pIVar12[uVar30].Flags & 0x100) == 0) {
                if (cVar8 < '\x01') {
                  fVar35 = pIVar12[uVar30].ContentMaxXUnfrozen;
LAB_0013be4b:
                  uVar34 = -(uint)(pIVar12[uVar30].ContentMaxXHeadersUsed <= fVar35);
                  fVar35 = (float)(~uVar34 & (uint)pIVar12[uVar30].ContentMaxXHeadersUsed |
                                  (uint)fVar35 & uVar34);
                }
                else {
                  if (bVar31 != 0) {
                    fVar35 = pIVar12[uVar30].ContentMaxXFrozen;
                    goto LAB_0013be4b;
                  }
                  fVar35 = pIVar12[uVar30].ContentMaxXUnfrozen;
                }
                pIVar1 = &pIVar12[uVar30].ClipRect.Max;
                if (pIVar1->x <= fVar35 && fVar35 != pIVar1->x) goto LAB_0013bf15;
              }
              uVar34 = ((byte)~bVar31 & 1) * 2;
              if (cVar8 < '\x01') {
                uVar34 = 2;
              }
              uVar34 = uVar34 | (bVar9 <= uVar30 || (char)bVar9 < '\x01');
              uVar28 = (ulong)uVar34;
              pfVar32 = local_d8 + uVar28 * 10;
              iVar26 = local_c4[uVar28 * 10 + -1];
              if (iVar26 == 0) {
                pfVar32[0] = 3.4028235e+38;
                pfVar32[1] = 3.4028235e+38;
                (&uStack_d0)[uVar28 * 5] = 0xff7fffffff7fffff;
                fVar35 = 3.4028235e+38;
              }
              else {
                fVar35 = *pfVar32;
              }
              local_c4[uVar28 * 10 + (ulong)(bVar10 >> 5)] =
                   local_c4[uVar28 * 10 + (ulong)(bVar10 >> 5)] | 1 << (bVar10 & 0x1f);
              local_c4[uVar28 * 10 + -1] = iVar26 + 1;
              fVar5 = (pIVar13->ClipRect).x;
              if (fVar5 < fVar35) {
                *pfVar32 = fVar5;
              }
              fVar35 = (pIVar13->ClipRect).y;
              if (fVar35 < local_d8[uVar28 * 10 + 1]) {
                local_d8[uVar28 * 10 + 1] = fVar35;
              }
              fVar35 = (pIVar13->ClipRect).z;
              if (*(float *)(&uStack_d0 + uVar28 * 5) <= fVar35 &&
                  fVar35 != *(float *)(&uStack_d0 + uVar28 * 5)) {
                *(float *)(&uStack_d0 + uVar28 * 5) = fVar35;
              }
              fVar35 = (pIVar13->ClipRect).w;
              pfVar32 = (float *)((long)&uStack_d0 + uVar28 * 0x28 + 4);
              if (*pfVar32 <= fVar35 && fVar35 != *pfVar32) {
                *(float *)((long)&uStack_d0 + uVar28 * 0x28 + 4) = fVar35;
              }
              uVar33 = uVar33 | 1 << uVar34;
            }
          }
LAB_0013bf15:
          uVar34 = 0;
        } while (('\0' < cVar8 & bVar31) != 0);
        pIVar12[uVar30].DrawChannelCurrent = 0xff;
      }
      uVar30 = uVar30 + 1;
    } while (uVar30 != (long)iVar21);
    if (uVar33 != 0) {
      iVar24 = pIVar11->_Count;
      iVar21 = iVar24 + -2;
      iVar26 = (pIVar20->DrawChannelsTempMergeBuffer).Capacity;
      if (iVar26 < iVar21) {
        if (iVar26 == 0) {
          iVar26 = 8;
        }
        else {
          iVar26 = iVar26 / 2 + iVar26;
        }
        if (iVar26 <= iVar21) {
          iVar26 = iVar21;
        }
        pIVar22 = (ImDrawChannel *)MemAlloc((long)iVar26 << 5);
        pIVar25 = (pIVar20->DrawChannelsTempMergeBuffer).Data;
        if (pIVar25 != (ImDrawChannel *)0x0) {
          memcpy(pIVar22,pIVar25,(long)(pIVar20->DrawChannelsTempMergeBuffer).Size << 5);
          MemFree((pIVar20->DrawChannelsTempMergeBuffer).Data);
        }
        (pIVar20->DrawChannelsTempMergeBuffer).Data = pIVar22;
        (pIVar20->DrawChannelsTempMergeBuffer).Capacity = iVar26;
        iVar24 = pIVar11->_Count;
      }
      else {
        pIVar22 = (pIVar20->DrawChannelsTempMergeBuffer).Data;
      }
      (pIVar20->DrawChannelsTempMergeBuffer).Size = iVar21;
      local_f8.Storage[0] = 0;
      local_f8.Storage[1] = 0;
      local_f8.Storage[2] = 0;
      local_f8.Storage[3] = 0;
      local_f8.Storage[4] = 0;
      ImBitArray<132,_0>::SetBitRange(&local_f8,2,iVar24);
      bVar10 = table->Bg2DrawChannelUnfrozen & 0x1f;
      local_f8.Storage[table->Bg2DrawChannelUnfrozen >> 5] =
           local_f8.Storage[table->Bg2DrawChannelUnfrozen >> 5] &
           (-2 << bVar10 | 0xfffffffeU >> 0x20 - bVar10);
      iVar21 = (pIVar11->_Count - (uint)('\0' < cVar8)) + -2;
      fVar35 = (table->HostClipRect).Min.x;
      fVar5 = (table->HostClipRect).Min.y;
      fVar6 = (table->HostClipRect).Max.x;
      fVar7 = (table->HostClipRect).Max.y;
      lVar27 = (long)local_c4;
      uVar29 = 0;
      do {
        iVar26 = local_c4[uVar29 * 10 + -1];
        if (iVar26 != 0) {
          fVar36 = local_d8[uVar29 * 10];
          fVar37 = local_d8[uVar29 * 10 + 1];
          fVar39 = *(float *)(&uStack_d0 + uVar29 * 5);
          fVar38 = *(float *)((long)&uStack_d0 + uVar29 * 0x28 + 4);
          if (((uVar29 & 1) == 0 || (char)bVar9 < '\x01') && (fVar35 <= fVar36)) {
            fVar36 = fVar35;
          }
          if ((uVar29 < 2 || cVar8 < '\x01') && (fVar5 <= fVar37)) {
            fVar37 = fVar5;
          }
          if ((uVar29 & 1) != 0) {
            uVar33 = -(uint)(fVar6 <= fVar39);
            fVar39 = (float)(~uVar33 & (uint)fVar6 | (uint)fVar39 & uVar33);
          }
          if ((1 < uVar29) && ((table->Flags & 0x20000) == 0)) {
            uVar33 = -(uint)(fVar7 <= fVar38);
            fVar38 = (float)(~uVar33 & (uint)fVar7 | (uint)fVar38 & uVar33);
          }
          lVar23 = 0;
          do {
            local_f8.Storage[lVar23] = local_f8.Storage[lVar23] & ~*(uint *)(lVar27 + lVar23 * 4);
            lVar23 = lVar23 + 1;
          } while (lVar23 != 5);
          iVar21 = iVar21 - iVar26;
          iVar24 = pIVar11->_Count;
          if (0 < iVar24) {
            lVar23 = 8;
            uVar30 = 0;
            do {
              uVar28 = uVar30 >> 5 & 0x7ffffff;
              if ((local_c4[uVar29 * 10 + uVar28] >> ((uint)uVar30 & 0x1f) & 1) != 0) {
                local_c4[uVar29 * 10 + uVar28] =
                     local_c4[uVar29 * 10 + uVar28] & ~(1 << ((byte)uVar30 & 0x1f));
                iVar26 = iVar26 + -1;
                pIVar25 = (pIVar11->_Channels).Data;
                pfVar32 = *(float **)((long)&(pIVar25->_CmdBuffer).Size + lVar23);
                *pfVar32 = fVar36;
                pfVar32[1] = fVar37;
                pfVar32[2] = fVar39;
                pfVar32[3] = fVar38;
                puVar2 = (undefined8 *)((long)pIVar25 + lVar23 + -8);
                uVar17 = *puVar2;
                pIVar13 = (ImDrawCmd *)puVar2[1];
                piVar3 = (int *)((long)&(pIVar25->_CmdBuffer).Data + lVar23);
                iVar24 = piVar3[1];
                iVar15 = piVar3[2];
                iVar16 = piVar3[3];
                (pIVar22->_IdxBuffer).Size = *piVar3;
                (pIVar22->_IdxBuffer).Capacity = iVar24;
                *(int *)&(pIVar22->_IdxBuffer).Data = iVar15;
                *(int *)((long)&(pIVar22->_IdxBuffer).Data + 4) = iVar16;
                (pIVar22->_CmdBuffer).Size = (int)uVar17;
                (pIVar22->_CmdBuffer).Capacity = (int)((ulong)uVar17 >> 0x20);
                (pIVar22->_CmdBuffer).Data = pIVar13;
                pIVar22 = pIVar22 + 1;
                iVar24 = pIVar11->_Count;
              }
              uVar30 = uVar30 + 1;
            } while (((long)uVar30 < (long)iVar24) && (lVar23 = lVar23 + 0x20, iVar26 != 0));
          }
        }
        if (uVar29 == 1 && '\0' < cVar8) {
          pIVar14 = (pIVar11->_Channels).Data;
          pIVar25 = pIVar14 + table->Bg2DrawChannelUnfrozen;
          iVar24 = (pIVar25->_CmdBuffer).Size;
          iVar15 = (pIVar25->_CmdBuffer).Capacity;
          pIVar13 = (pIVar25->_CmdBuffer).Data;
          pIVar4 = &pIVar14[table->Bg2DrawChannelUnfrozen]._IdxBuffer;
          iVar26 = pIVar4->Capacity;
          puVar18 = pIVar4->Data;
          (pIVar22->_IdxBuffer).Size = pIVar4->Size;
          (pIVar22->_IdxBuffer).Capacity = iVar26;
          (pIVar22->_IdxBuffer).Data = puVar18;
          (pIVar22->_CmdBuffer).Size = iVar24;
          (pIVar22->_CmdBuffer).Capacity = iVar15;
          (pIVar22->_CmdBuffer).Data = pIVar13;
          pIVar22 = pIVar22 + 1;
        }
        uVar29 = uVar29 + 1;
        lVar27 = lVar27 + 0x28;
      } while (uVar29 != 4);
      iVar26 = pIVar11->_Count;
      if ((0 < iVar26) && (iVar21 != 0)) {
        lVar27 = 0;
        uVar29 = 0;
        do {
          if ((local_f8.Storage[uVar29 >> 5 & 0x7ffffff] >> ((uint)uVar29 & 0x1f) & 1) != 0) {
            pIVar25 = (pIVar11->_Channels).Data;
            puVar2 = (undefined8 *)((long)&(pIVar25->_CmdBuffer).Size + lVar27);
            uVar17 = *puVar2;
            pIVar13 = (ImDrawCmd *)puVar2[1];
            puVar2 = (undefined8 *)((long)&(pIVar25->_IdxBuffer).Size + lVar27);
            uVar19 = *puVar2;
            puVar18 = (unsigned_short *)puVar2[1];
            (pIVar22->_IdxBuffer).Size = (int)uVar19;
            (pIVar22->_IdxBuffer).Capacity = (int)((ulong)uVar19 >> 0x20);
            (pIVar22->_IdxBuffer).Data = puVar18;
            (pIVar22->_CmdBuffer).Size = (int)uVar17;
            (pIVar22->_CmdBuffer).Capacity = (int)((ulong)uVar17 >> 0x20);
            (pIVar22->_CmdBuffer).Data = pIVar13;
            pIVar22 = pIVar22 + 1;
            iVar21 = iVar21 + -1;
            iVar26 = pIVar11->_Count;
          }
          uVar29 = uVar29 + 1;
        } while (((long)uVar29 < (long)iVar26) && (lVar27 = lVar27 + 0x20, iVar21 != 0));
      }
      memcpy((pIVar11->_Channels).Data + 2,(pIVar20->DrawChannelsTempMergeBuffer).Data,
             (long)iVar26 * 0x20 - 0x40);
    }
  }
  return;
}

Assistant:

void ImGui::TableMergeDrawChannels(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    ImDrawListSplitter* splitter = table->DrawSplitter;
    const bool has_freeze_v = (table->FreezeRowsCount > 0);
    const bool has_freeze_h = (table->FreezeColumnsCount > 0);
    IM_ASSERT(splitter->_Current == 0);

    // Track which groups we are going to attempt to merge, and which channels goes into each group.
    struct MergeGroup
    {
        ImRect  ClipRect;
        int     ChannelsCount;
        ImBitArray<IMGUI_TABLE_MAX_DRAW_CHANNELS> ChannelsMask;

        MergeGroup() { ChannelsCount = 0; }
    };
    int merge_group_mask = 0x00;
    MergeGroup merge_groups[4];

    // 1. Scan channels and take note of those which can be merged
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        if ((table->VisibleMaskByIndex & ((ImU64)1 << column_n)) == 0)
            continue;
        ImGuiTableColumn* column = &table->Columns[column_n];

        const int merge_group_sub_count = has_freeze_v ? 2 : 1;
        for (int merge_group_sub_n = 0; merge_group_sub_n < merge_group_sub_count; merge_group_sub_n++)
        {
            const int channel_no = (merge_group_sub_n == 0) ? column->DrawChannelFrozen : column->DrawChannelUnfrozen;

            // Don't attempt to merge if there are multiple draw calls within the column
            ImDrawChannel* src_channel = &splitter->_Channels[channel_no];
            if (src_channel->_CmdBuffer.Size > 0 && src_channel->_CmdBuffer.back().ElemCount == 0 && src_channel->_CmdBuffer.back().UserCallback != NULL) // Equivalent of PopUnusedDrawCmd()
                src_channel->_CmdBuffer.pop_back();
            if (src_channel->_CmdBuffer.Size != 1)
                continue;

            // Find out the width of this merge group and check if it will fit in our column
            // (note that we assume that rendering didn't stray on the left direction. we should need a CursorMinPos to detect it)
            if (!(column->Flags & ImGuiTableColumnFlags_NoClip))
            {
                float content_max_x;
                if (!has_freeze_v)
                    content_max_x = ImMax(column->ContentMaxXUnfrozen, column->ContentMaxXHeadersUsed); // No row freeze
                else if (merge_group_sub_n == 0)
                    content_max_x = ImMax(column->ContentMaxXFrozen, column->ContentMaxXHeadersUsed);   // Row freeze: use width before freeze
                else
                    content_max_x = column->ContentMaxXUnfrozen;                                        // Row freeze: use width after freeze
                if (content_max_x > column->ClipRect.Max.x)
                    continue;
            }

            const int merge_group_n = (has_freeze_h && column_n < table->FreezeColumnsCount ? 0 : 1) + (has_freeze_v && merge_group_sub_n == 0 ? 0 : 2);
            IM_ASSERT(channel_no < IMGUI_TABLE_MAX_DRAW_CHANNELS);
            MergeGroup* merge_group = &merge_groups[merge_group_n];
            if (merge_group->ChannelsCount == 0)
                merge_group->ClipRect = ImRect(+FLT_MAX, +FLT_MAX, -FLT_MAX, -FLT_MAX);
            merge_group->ChannelsMask.SetBit(channel_no);
            merge_group->ChannelsCount++;
            merge_group->ClipRect.Add(src_channel->_CmdBuffer[0].ClipRect);
            merge_group_mask |= (1 << merge_group_n);
        }

        // Invalidate current draw channel
        // (we don't clear DrawChannelFrozen/DrawChannelUnfrozen solely to facilitate debugging/later inspection of data)
        column->DrawChannelCurrent = (ImGuiTableDrawChannelIdx)-1;
    }

    // [DEBUG] Display merge groups
#if 0
    if (g.IO.KeyShift)
        for (int merge_group_n = 0; merge_group_n < IM_ARRAYSIZE(merge_groups); merge_group_n++)
        {
            MergeGroup* merge_group = &merge_groups[merge_group_n];
            if (merge_group->ChannelsCount == 0)
                continue;
            char buf[32];
            ImFormatString(buf, 32, "MG%d:%d", merge_group_n, merge_group->ChannelsCount);
            ImVec2 text_pos = merge_group->ClipRect.Min + ImVec2(4, 4);
            ImVec2 text_size = CalcTextSize(buf, NULL);
            GetForegroundDrawList()->AddRectFilled(text_pos, text_pos + text_size, IM_COL32(0, 0, 0, 255));
            GetForegroundDrawList()->AddText(text_pos, IM_COL32(255, 255, 0, 255), buf, NULL);
            GetForegroundDrawList()->AddRect(merge_group->ClipRect.Min, merge_group->ClipRect.Max, IM_COL32(255, 255, 0, 255));
        }
#endif

    // 2. Rewrite channel list in our preferred order
    if (merge_group_mask != 0)
    {
        // We skip channel 0 (Bg0/Bg1) and 1 (Bg2 frozen) from the shuffling since they won't move - see channels allocation in TableSetupDrawChannels().
        const int LEADING_DRAW_CHANNELS = 2;
        g.DrawChannelsTempMergeBuffer.resize(splitter->_Count - LEADING_DRAW_CHANNELS); // Use shared temporary storage so the allocation gets amortized
        ImDrawChannel* dst_tmp = g.DrawChannelsTempMergeBuffer.Data;
        ImBitArray<IMGUI_TABLE_MAX_DRAW_CHANNELS> remaining_mask;                       // We need 132-bit of storage
        remaining_mask.SetBitRange(LEADING_DRAW_CHANNELS, splitter->_Count);
        remaining_mask.ClearBit(table->Bg2DrawChannelUnfrozen);
        IM_ASSERT(has_freeze_v == false || table->Bg2DrawChannelUnfrozen != TABLE_DRAW_CHANNEL_BG2_FROZEN);
        int remaining_count = splitter->_Count - (has_freeze_v ? LEADING_DRAW_CHANNELS + 1 : LEADING_DRAW_CHANNELS);
        //ImRect host_rect = (table->InnerWindow == table->OuterWindow) ? table->InnerClipRect : table->HostClipRect;
        ImRect host_rect = table->HostClipRect;
        for (int merge_group_n = 0; merge_group_n < IM_ARRAYSIZE(merge_groups); merge_group_n++)
        {
            if (int merge_channels_count = merge_groups[merge_group_n].ChannelsCount)
            {
                MergeGroup* merge_group = &merge_groups[merge_group_n];
                ImRect merge_clip_rect = merge_group->ClipRect;

                // Extend outer-most clip limits to match those of host, so draw calls can be merged even if
                // outer-most columns have some outer padding offsetting them from their parent ClipRect.
                // The principal cases this is dealing with are:
                // - On a same-window table (not scrolling = single group), all fitting columns ClipRect -> will extend and match host ClipRect -> will merge
                // - Columns can use padding and have left-most ClipRect.Min.x and right-most ClipRect.Max.x != from host ClipRect -> will extend and match host ClipRect -> will merge
                // FIXME-TABLE FIXME-WORKRECT: We are wasting a merge opportunity on tables without scrolling if column doesn't fit
                // within host clip rect, solely because of the half-padding difference between window->WorkRect and window->InnerClipRect.
                if ((merge_group_n & 1) == 0 || !has_freeze_h)
                    merge_clip_rect.Min.x = ImMin(merge_clip_rect.Min.x, host_rect.Min.x);
                if ((merge_group_n & 2) == 0 || !has_freeze_v)
                    merge_clip_rect.Min.y = ImMin(merge_clip_rect.Min.y, host_rect.Min.y);
                if ((merge_group_n & 1) != 0)
                    merge_clip_rect.Max.x = ImMax(merge_clip_rect.Max.x, host_rect.Max.x);
                if ((merge_group_n & 2) != 0 && (table->Flags & ImGuiTableFlags_NoHostExtendY) == 0)
                    merge_clip_rect.Max.y = ImMax(merge_clip_rect.Max.y, host_rect.Max.y);
#if 0
                GetOverlayDrawList()->AddRect(merge_group->ClipRect.Min, merge_group->ClipRect.Max, IM_COL32(255, 0, 0, 200), 0.0f, 0, 1.0f);
                GetOverlayDrawList()->AddLine(merge_group->ClipRect.Min, merge_clip_rect.Min, IM_COL32(255, 100, 0, 200));
                GetOverlayDrawList()->AddLine(merge_group->ClipRect.Max, merge_clip_rect.Max, IM_COL32(255, 100, 0, 200));
#endif
                remaining_count -= merge_group->ChannelsCount;
                for (int n = 0; n < IM_ARRAYSIZE(remaining_mask.Storage); n++)
                    remaining_mask.Storage[n] &= ~merge_group->ChannelsMask.Storage[n];
                for (int n = 0; n < splitter->_Count && merge_channels_count != 0; n++)
                {
                    // Copy + overwrite new clip rect
                    if (!merge_group->ChannelsMask.TestBit(n))
                        continue;
                    merge_group->ChannelsMask.ClearBit(n);
                    merge_channels_count--;

                    ImDrawChannel* channel = &splitter->_Channels[n];
                    IM_ASSERT(channel->_CmdBuffer.Size == 1 && merge_clip_rect.Contains(ImRect(channel->_CmdBuffer[0].ClipRect)));
                    channel->_CmdBuffer[0].ClipRect = merge_clip_rect.ToVec4();
                    memcpy(dst_tmp++, channel, sizeof(ImDrawChannel));
                }
            }

            // Make sure Bg2DrawChannelUnfrozen appears in the middle of our groups (whereas Bg0/Bg1 and Bg2 frozen are fixed to 0 and 1)
            if (merge_group_n == 1 && has_freeze_v)
                memcpy(dst_tmp++, &splitter->_Channels[table->Bg2DrawChannelUnfrozen], sizeof(ImDrawChannel));
        }

        // Append unmergeable channels that we didn't reorder at the end of the list
        for (int n = 0; n < splitter->_Count && remaining_count != 0; n++)
        {
            if (!remaining_mask.TestBit(n))
                continue;
            ImDrawChannel* channel = &splitter->_Channels[n];
            memcpy(dst_tmp++, channel, sizeof(ImDrawChannel));
            remaining_count--;
        }
        IM_ASSERT(dst_tmp == g.DrawChannelsTempMergeBuffer.Data + g.DrawChannelsTempMergeBuffer.Size);
        memcpy(splitter->_Channels.Data + LEADING_DRAW_CHANNELS, g.DrawChannelsTempMergeBuffer.Data, (splitter->_Count - LEADING_DRAW_CHANNELS) * sizeof(ImDrawChannel));
    }
}